

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Reader::PerformGets(BP3Reader *this)

{
  bool bVar1;
  int iVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pVVar6
  ;
  Variable<char> *pVVar7;
  Variable<signed_char> *pVVar8;
  Variable<int> *pVVar9;
  Variable<long> *pVVar10;
  Variable<unsigned_char> *pVVar11;
  Variable<unsigned_short> *pVVar12;
  Variable<unsigned_int> *pVVar13;
  Variable<unsigned_long> *pVVar14;
  Variable<float> *pVVar15;
  Variable<double> *pVVar16;
  Variable<long_double> *pVVar17;
  Variable<std::complex<float>_> *pVVar18;
  long in_RDI;
  BPInfo *blockInfo_14;
  iterator __end19;
  iterator __begin19;
  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
  *__range19;
  Variable<std::complex<double>_> *variable_14;
  BPInfo *blockInfo_13;
  iterator __end18;
  iterator __begin18;
  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
  *__range18;
  Variable<std::complex<float>_> *variable_13;
  BPInfo *blockInfo_12;
  iterator __end17;
  iterator __begin17;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *__range17;
  Variable<long_double> *variable_12;
  BPInfo *blockInfo_11;
  iterator __end16;
  iterator __begin16;
  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
  *__range16;
  Variable<double> *variable_11;
  BPInfo *blockInfo_10;
  iterator __end15;
  iterator __begin15;
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  *__range15;
  Variable<float> *variable_10;
  BPInfo *blockInfo_9;
  iterator __end14;
  iterator __begin14;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  *__range14;
  Variable<unsigned_long> *variable_9;
  BPInfo *blockInfo_8;
  iterator __end13;
  iterator __begin13;
  vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
  *__range13;
  Variable<unsigned_int> *variable_8;
  BPInfo *blockInfo_7;
  iterator __end12;
  iterator __begin12;
  vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
  *__range12;
  Variable<unsigned_short> *variable_7;
  BPInfo *blockInfo_6;
  iterator __end11;
  iterator __begin11;
  vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  *__range11;
  Variable<unsigned_char> *variable_6;
  BPInfo *blockInfo_5;
  iterator __end10;
  iterator __begin10;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  *__range10;
  Variable<long> *variable_5;
  BPInfo *blockInfo_4;
  iterator __end9;
  iterator __begin9;
  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
  *__range9;
  Variable<int> *variable_4;
  BPInfo *blockInfo_3;
  iterator __end8;
  iterator __begin8;
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  *__range8;
  Variable<short> *variable_3;
  BPInfo *blockInfo_2;
  iterator __end7;
  iterator __begin7;
  vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
  *__range7;
  Variable<signed_char> *variable_2;
  BPInfo *blockInfo_1;
  iterator __end6;
  iterator __begin6;
  vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
  *__range6;
  Variable<char> *variable_1;
  BPInfo *blockInfo;
  iterator __end5;
  iterator __begin5;
  vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
  *__range5;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable;
  DataType type;
  string *name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ScopedTimer __var2110;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff908;
  Variable<std::complex<double>_> *in_stack_fffffffffffff910;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff938;
  IO *in_stack_fffffffffffff940;
  string *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  DataType in_stack_fffffffffffffa6c;
  Variable<short> *in_stack_fffffffffffffa70;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffab8;
  BP3Reader *in_stack_fffffffffffffac0;
  __normal_iterator<adios2::core::Variable<std::complex<double>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>_>
  local_4f0;
  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
  *local_4e8;
  allocator local_4d9;
  string local_4d8 [32];
  Variable<std::complex<double>_> *local_4b8;
  reference local_4b0;
  BPInfo *local_4a8;
  __normal_iterator<adios2::core::Variable<std::complex<float>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>
  local_4a0;
  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
  *local_498;
  undefined1 local_489 [33];
  Variable<std::complex<float>_> *local_468;
  undefined8 local_460;
  BPInfo *local_458;
  __normal_iterator<adios2::core::Variable<long_double>::BPInfo_*,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>
  local_450;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *local_448;
  allocator local_439;
  string local_438 [32];
  Variable<long_double> *local_418;
  reference local_410;
  BPInfo *local_408;
  __normal_iterator<adios2::core::Variable<double>::BPInfo_*,_std::vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>_>
  local_400;
  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
  *local_3f8;
  allocator local_3e9;
  string local_3e8 [32];
  Variable<double> *local_3c8;
  reference local_3c0;
  BPInfo *local_3b8;
  __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
  local_3b0;
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  *local_3a8;
  allocator local_399;
  string local_398 [32];
  Variable<float> *local_378;
  reference local_370;
  BPInfo *local_368;
  __normal_iterator<adios2::core::Variable<unsigned_long>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
  local_360;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  *local_358;
  allocator local_349;
  string local_348 [32];
  Variable<unsigned_long> *local_328;
  reference local_320;
  BPInfo *local_318;
  __normal_iterator<adios2::core::Variable<unsigned_int>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>_>
  local_310;
  vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
  *local_308;
  allocator local_2f9;
  string local_2f8 [32];
  Variable<unsigned_int> *local_2d8;
  reference local_2d0;
  BPInfo *local_2c8;
  __normal_iterator<adios2::core::Variable<unsigned_short>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>_>
  local_2c0;
  vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
  *local_2b8;
  allocator local_2a9;
  string local_2a8 [8];
  BPInfo *in_stack_fffffffffffffd60;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd68;
  BP3Deserializer *in_stack_fffffffffffffd70;
  __normal_iterator<adios2::core::Variable<unsigned_char>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>_>
  local_270;
  vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  *local_268;
  allocator local_259;
  string local_258 [32];
  Variable<unsigned_char> *local_238;
  reference local_230;
  BPInfo *local_228;
  __normal_iterator<adios2::core::Variable<long>::BPInfo_*,_std::vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>_>
  local_220;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  *local_218;
  allocator local_209;
  string local_208 [32];
  Variable<long> *local_1e8;
  reference local_1e0;
  BPInfo *local_1d8;
  __normal_iterator<adios2::core::Variable<int>::BPInfo_*,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>
  local_1d0;
  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
  *local_1c8;
  undefined1 local_1b9 [33];
  Variable<int> *local_198;
  reference local_190;
  BPInfo *local_188;
  __normal_iterator<adios2::core::Variable<short>::BPInfo_*,_std::vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>_>
  local_180;
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  *local_178;
  allocator local_169;
  string local_168 [32];
  Variable<short> *local_148;
  reference local_140;
  BPInfo *local_138;
  __normal_iterator<adios2::core::Variable<signed_char>::BPInfo_*,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>
  local_130;
  vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
  *local_128;
  allocator local_119;
  string local_118 [32];
  Variable<signed_char> *local_f8;
  reference local_f0;
  BPInfo *local_e8;
  __normal_iterator<adios2::core::Variable<char>::BPInfo_*,_std::vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>_>
  local_e0;
  vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
  *local_d8;
  undefined1 local_c9 [33];
  Variable<char> *local_a8;
  reference local_a0;
  BPInfo *local_98;
  __normal_iterator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>_>
  local_90 [2];
  allocator local_79;
  string local_78 [32];
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  DataType local_4c;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  _Self local_40;
  _Self local_38;
  long local_30;
  undefined4 local_24;
  
  if ((PerformGets()::__var110 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&PerformGets()::__var110), iVar2 != 0)) {
    PerformGets::__var110 = (void *)ps_timer_create_("BP3Reader::PerformGets");
    __cxa_guard_release(&PerformGets()::__var110);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x9e9837);
  if (bVar1) {
    local_24 = 1;
  }
  else {
    local_30 = in_RDI + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18) + 0x428;
    local_38._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffff908);
    local_40._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffff908);
    while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
      local_48 = (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffff910);
      DVar3 = IO::InquireVariableType(in_stack_fffffffffffff940,(string *)in_stack_fffffffffffff938)
      ;
      local_4c = DVar3;
      if (DVar3 != Struct) {
        DVar4 = helper::GetDataType<std::__cxx11::string>();
        DVar5 = local_4c;
        if (DVar3 == DVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_78,"in call to PerformGets, EndStep or Close",&local_79);
          pVVar6 = Engine::FindVariable<std::__cxx11::string>
                             ((Engine *)in_stack_fffffffffffffa70,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                              in_stack_fffffffffffffa60);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
          local_90[1]._M_current = (BPInfo *)&pVVar6->m_BlocksInfo;
          local_58 = pVVar6;
          local_90[0]._M_current =
               (BPInfo *)
               std::
               vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
               ::begin((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                        *)in_stack_fffffffffffff908);
          local_98 = (BPInfo *)
                     std::
                     vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                     ::end((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                            *)in_stack_fffffffffffff908);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>_>
                                     *)in_stack_fffffffffffff910,
                                    (__normal_iterator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>_>
                                     *)in_stack_fffffffffffff908), bVar1) {
            local_a0 = __gnu_cxx::
                       __normal_iterator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>_>
                       ::operator*(local_90);
            adios2::format::BP3Deserializer::SetVariableBlockInfo<std::__cxx11::string>
                      (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60
                      );
            __gnu_cxx::
            __normal_iterator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>_>
            ::operator++(local_90);
          }
          ReadVariableBlocks<std::__cxx11::string>
                    (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
          std::
          vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
          ::clear((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                   *)0x9e9b1a);
        }
        else {
          DVar4 = helper::GetDataType<char>();
          DVar3 = local_4c;
          if (DVar5 == DVar4) {
            in_stack_fffffffffffffac0 = (BP3Reader *)local_c9;
            in_stack_fffffffffffffab8 = local_48;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_c9 + 1),"in call to PerformGets, EndStep or Close",
                       (allocator *)in_stack_fffffffffffffac0);
            pVVar7 = Engine::FindVariable<char>
                               ((Engine *)in_stack_fffffffffffffa70,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                                in_stack_fffffffffffffa60);
            std::__cxx11::string::~string((string *)(local_c9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_c9);
            local_d8 = &pVVar7->m_BlocksInfo;
            local_a8 = pVVar7;
            local_e0._M_current =
                 (BPInfo *)
                 std::
                 vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                 ::begin((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                          *)in_stack_fffffffffffff908);
            local_e8 = (BPInfo *)
                       std::
                       vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                       ::end((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                              *)in_stack_fffffffffffff908);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<adios2::core::Variable<char>::BPInfo_*,_std::vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>_>
                                       *)in_stack_fffffffffffff910,
                                      (__normal_iterator<adios2::core::Variable<char>::BPInfo_*,_std::vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>_>
                                       *)in_stack_fffffffffffff908), bVar1) {
              local_f0 = __gnu_cxx::
                         __normal_iterator<adios2::core::Variable<char>::BPInfo_*,_std::vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>_>
                         ::operator*(&local_e0);
              adios2::format::BP3Deserializer::SetVariableBlockInfo<char>
                        (in_stack_fffffffffffffd70,(Variable<char> *)in_stack_fffffffffffffd68,
                         (BPInfo *)in_stack_fffffffffffffd60);
              __gnu_cxx::
              __normal_iterator<adios2::core::Variable<char>::BPInfo_*,_std::vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>_>
              ::operator++(&local_e0);
            }
            ReadVariableBlocks<char>
                      (in_stack_fffffffffffffac0,(Variable<char> *)in_stack_fffffffffffffab8);
            std::
            vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
            ::clear((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                     *)0x9e9cf5);
          }
          else {
            DVar4 = helper::GetDataType<signed_char>();
            DVar5 = local_4c;
            if (DVar3 == DVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_118,"in call to PerformGets, EndStep or Close",&local_119);
              pVVar8 = Engine::FindVariable<signed_char>
                                 ((Engine *)in_stack_fffffffffffffa70,
                                  (string *)
                                  CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                                  in_stack_fffffffffffffa60);
              std::__cxx11::string::~string(local_118);
              std::allocator<char>::~allocator((allocator<char> *)&local_119);
              local_128 = &pVVar8->m_BlocksInfo;
              local_f8 = pVVar8;
              local_130._M_current =
                   (BPInfo *)
                   std::
                   vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                   ::begin((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                            *)in_stack_fffffffffffff908);
              local_138 = (BPInfo *)
                          std::
                          vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                          ::end((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                                 *)in_stack_fffffffffffff908);
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<adios2::core::Variable<signed_char>::BPInfo_*,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>
                                         *)in_stack_fffffffffffff910,
                                        (__normal_iterator<adios2::core::Variable<signed_char>::BPInfo_*,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>
                                         *)in_stack_fffffffffffff908), bVar1) {
                local_140 = __gnu_cxx::
                            __normal_iterator<adios2::core::Variable<signed_char>::BPInfo_*,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>
                            ::operator*(&local_130);
                adios2::format::BP3Deserializer::SetVariableBlockInfo<signed_char>
                          (in_stack_fffffffffffffd70,
                           (Variable<signed_char> *)in_stack_fffffffffffffd68,
                           (BPInfo *)in_stack_fffffffffffffd60);
                __gnu_cxx::
                __normal_iterator<adios2::core::Variable<signed_char>::BPInfo_*,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>
                ::operator++(&local_130);
              }
              ReadVariableBlocks<signed_char>
                        (in_stack_fffffffffffffac0,
                         (Variable<signed_char> *)in_stack_fffffffffffffab8);
              std::
              vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
              ::clear((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                       *)0x9e9ed0);
            }
            else {
              DVar3 = helper::GetDataType<short>();
              if (DVar5 == DVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_168,"in call to PerformGets, EndStep or Close",&local_169);
                in_stack_fffffffffffffa70 =
                     Engine::FindVariable<short>
                               ((Engine *)in_stack_fffffffffffffa70,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                                in_stack_fffffffffffffa60);
                std::__cxx11::string::~string(local_168);
                std::allocator<char>::~allocator((allocator<char> *)&local_169);
                local_178 = &in_stack_fffffffffffffa70->m_BlocksInfo;
                local_148 = in_stack_fffffffffffffa70;
                local_180._M_current =
                     (BPInfo *)
                     std::
                     vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                     ::begin((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                              *)in_stack_fffffffffffff908);
                local_188 = (BPInfo *)
                            std::
                            vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                            ::end((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                   *)in_stack_fffffffffffff908);
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<adios2::core::Variable<short>::BPInfo_*,_std::vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>_>
                                           *)in_stack_fffffffffffff910,
                                          (__normal_iterator<adios2::core::Variable<short>::BPInfo_*,_std::vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>_>
                                           *)in_stack_fffffffffffff908), bVar1) {
                  local_190 = __gnu_cxx::
                              __normal_iterator<adios2::core::Variable<short>::BPInfo_*,_std::vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>_>
                              ::operator*(&local_180);
                  adios2::format::BP3Deserializer::SetVariableBlockInfo<short>
                            (in_stack_fffffffffffffd70,(Variable<short> *)in_stack_fffffffffffffd68,
                             (BPInfo *)in_stack_fffffffffffffd60);
                  __gnu_cxx::
                  __normal_iterator<adios2::core::Variable<short>::BPInfo_*,_std::vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>_>
                  ::operator++(&local_180);
                }
                ReadVariableBlocks<short>
                          (in_stack_fffffffffffffac0,(Variable<short> *)in_stack_fffffffffffffab8);
                std::
                vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                ::clear((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                         *)0x9ea0ab);
              }
              else {
                in_stack_fffffffffffffa6c = local_4c;
                DVar5 = helper::GetDataType<int>();
                DVar3 = local_4c;
                if (in_stack_fffffffffffffa6c == DVar5) {
                  in_stack_fffffffffffffa60 = (string *)local_1b9;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)(local_1b9 + 1),"in call to PerformGets, EndStep or Close",
                             (allocator *)in_stack_fffffffffffffa60);
                  pVVar9 = Engine::FindVariable<int>
                                     ((Engine *)in_stack_fffffffffffffa70,
                                      (string *)
                                      CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                                      in_stack_fffffffffffffa60);
                  std::__cxx11::string::~string((string *)(local_1b9 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
                  local_1c8 = &pVVar9->m_BlocksInfo;
                  local_198 = pVVar9;
                  local_1d0._M_current =
                       (BPInfo *)
                       std::
                       vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                       ::begin((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                *)in_stack_fffffffffffff908);
                  local_1d8 = (BPInfo *)
                              std::
                              vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                              ::end((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                     *)in_stack_fffffffffffff908);
                  while (bVar1 = __gnu_cxx::operator!=
                                           ((__normal_iterator<adios2::core::Variable<int>::BPInfo_*,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>
                                             *)in_stack_fffffffffffff910,
                                            (__normal_iterator<adios2::core::Variable<int>::BPInfo_*,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>
                                             *)in_stack_fffffffffffff908), bVar1) {
                    local_1e0 = __gnu_cxx::
                                __normal_iterator<adios2::core::Variable<int>::BPInfo_*,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>
                                ::operator*(&local_1d0);
                    adios2::format::BP3Deserializer::SetVariableBlockInfo<int>
                              (in_stack_fffffffffffffd70,(Variable<int> *)in_stack_fffffffffffffd68,
                               (BPInfo *)in_stack_fffffffffffffd60);
                    __gnu_cxx::
                    __normal_iterator<adios2::core::Variable<int>::BPInfo_*,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>
                    ::operator++(&local_1d0);
                  }
                  ReadVariableBlocks<int>
                            (in_stack_fffffffffffffac0,(Variable<int> *)in_stack_fffffffffffffab8);
                  std::
                  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                  ::clear((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                           *)0x9ea286);
                }
                else {
                  DVar4 = helper::GetDataType<long>();
                  DVar5 = local_4c;
                  if (DVar3 == DVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_208,"in call to PerformGets, EndStep or Close",&local_209);
                    pVVar10 = Engine::FindVariable<long>
                                        ((Engine *)in_stack_fffffffffffffa70,
                                         (string *)
                                         CONCAT44(in_stack_fffffffffffffa6c,
                                                  in_stack_fffffffffffffa68),
                                         in_stack_fffffffffffffa60);
                    std::__cxx11::string::~string(local_208);
                    std::allocator<char>::~allocator((allocator<char> *)&local_209);
                    local_218 = &pVVar10->m_BlocksInfo;
                    local_1e8 = pVVar10;
                    local_220._M_current =
                         (BPInfo *)
                         std::
                         vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                         ::begin((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                  *)in_stack_fffffffffffff908);
                    local_228 = (BPInfo *)
                                std::
                                vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                ::end((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                       *)in_stack_fffffffffffff908);
                    while (bVar1 = __gnu_cxx::operator!=
                                             ((__normal_iterator<adios2::core::Variable<long>::BPInfo_*,_std::vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>_>
                                               *)in_stack_fffffffffffff910,
                                              (__normal_iterator<adios2::core::Variable<long>::BPInfo_*,_std::vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>_>
                                               *)in_stack_fffffffffffff908), bVar1) {
                      local_230 = __gnu_cxx::
                                  __normal_iterator<adios2::core::Variable<long>::BPInfo_*,_std::vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>_>
                                  ::operator*(&local_220);
                      adios2::format::BP3Deserializer::SetVariableBlockInfo<long>
                                (in_stack_fffffffffffffd70,
                                 (Variable<long> *)in_stack_fffffffffffffd68,
                                 (BPInfo *)in_stack_fffffffffffffd60);
                      __gnu_cxx::
                      __normal_iterator<adios2::core::Variable<long>::BPInfo_*,_std::vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>_>
                      ::operator++(&local_220);
                    }
                    ReadVariableBlocks<long>
                              (in_stack_fffffffffffffac0,(Variable<long> *)in_stack_fffffffffffffab8
                              );
                    std::
                    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                    ::clear((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                             *)0x9ea461);
                  }
                  else {
                    DVar4 = helper::GetDataType<unsigned_char>();
                    DVar3 = local_4c;
                    if (DVar5 == DVar4) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_258,"in call to PerformGets, EndStep or Close",&local_259);
                      pVVar11 = Engine::FindVariable<unsigned_char>
                                          ((Engine *)in_stack_fffffffffffffa70,
                                           (string *)
                                           CONCAT44(in_stack_fffffffffffffa6c,
                                                    in_stack_fffffffffffffa68),
                                           in_stack_fffffffffffffa60);
                      std::__cxx11::string::~string(local_258);
                      std::allocator<char>::~allocator((allocator<char> *)&local_259);
                      local_268 = &pVVar11->m_BlocksInfo;
                      local_238 = pVVar11;
                      local_270._M_current =
                           (BPInfo *)
                           std::
                           vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                           ::begin((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                    *)in_stack_fffffffffffff908);
                      std::
                      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                      ::end((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                             *)in_stack_fffffffffffff908);
                      while (bVar1 = __gnu_cxx::operator!=
                                               ((__normal_iterator<adios2::core::Variable<unsigned_char>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>_>
                                                 *)in_stack_fffffffffffff910,
                                                (__normal_iterator<adios2::core::Variable<unsigned_char>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>_>
                                                 *)in_stack_fffffffffffff908), bVar1) {
                        __gnu_cxx::
                        __normal_iterator<adios2::core::Variable<unsigned_char>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>_>
                        ::operator*(&local_270);
                        adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_char>
                                  (in_stack_fffffffffffffd70,
                                   (Variable<unsigned_char> *)in_stack_fffffffffffffd68,
                                   (BPInfo *)in_stack_fffffffffffffd60);
                        __gnu_cxx::
                        __normal_iterator<adios2::core::Variable<unsigned_char>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>_>
                        ::operator++(&local_270);
                      }
                      ReadVariableBlocks<unsigned_char>
                                (in_stack_fffffffffffffac0,
                                 (Variable<unsigned_char> *)in_stack_fffffffffffffab8);
                      std::
                      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                      ::clear((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                               *)0x9ea63c);
                    }
                    else {
                      DVar4 = helper::GetDataType<unsigned_short>();
                      DVar5 = local_4c;
                      if (DVar3 == DVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_2a8,"in call to PerformGets, EndStep or Close",&local_2a9);
                        pVVar12 = Engine::FindVariable<unsigned_short>
                                            ((Engine *)in_stack_fffffffffffffa70,
                                             (string *)
                                             CONCAT44(in_stack_fffffffffffffa6c,
                                                      in_stack_fffffffffffffa68),
                                             in_stack_fffffffffffffa60);
                        std::__cxx11::string::~string(local_2a8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
                        local_2b8 = &pVVar12->m_BlocksInfo;
                        local_2c0._M_current =
                             (BPInfo *)
                             std::
                             vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                             ::begin((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                      *)in_stack_fffffffffffff908);
                        local_2c8 = (BPInfo *)
                                    std::
                                    vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                    ::end((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                           *)in_stack_fffffffffffff908);
                        while (bVar1 = __gnu_cxx::operator!=
                                                 ((
                                                  __normal_iterator<adios2::core::Variable<unsigned_short>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<unsigned_short>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                          local_2d0 = __gnu_cxx::
                                      __normal_iterator<adios2::core::Variable<unsigned_short>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>_>
                                      ::operator*(&local_2c0);
                          adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_short>
                                    (in_stack_fffffffffffffd70,
                                     (Variable<unsigned_short> *)in_stack_fffffffffffffd68,
                                     (BPInfo *)in_stack_fffffffffffffd60);
                          __gnu_cxx::
                          __normal_iterator<adios2::core::Variable<unsigned_short>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>_>
                          ::operator++(&local_2c0);
                        }
                        ReadVariableBlocks<unsigned_short>
                                  (in_stack_fffffffffffffac0,
                                   (Variable<unsigned_short> *)in_stack_fffffffffffffab8);
                        std::
                        vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                        ::clear((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                 *)0x9ea817);
                      }
                      else {
                        DVar4 = helper::GetDataType<unsigned_int>();
                        DVar3 = local_4c;
                        if (DVar5 == DVar4) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_2f8,"in call to PerformGets, EndStep or Close",&local_2f9
                                    );
                          pVVar13 = Engine::FindVariable<unsigned_int>
                                              ((Engine *)in_stack_fffffffffffffa70,
                                               (string *)
                                               CONCAT44(in_stack_fffffffffffffa6c,
                                                        in_stack_fffffffffffffa68),
                                               in_stack_fffffffffffffa60);
                          std::__cxx11::string::~string(local_2f8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
                          local_308 = &pVVar13->m_BlocksInfo;
                          local_2d8 = pVVar13;
                          local_310._M_current =
                               (BPInfo *)
                               std::
                               vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                               ::begin((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                        *)in_stack_fffffffffffff908);
                          local_318 = (BPInfo *)
                                      std::
                                      vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                      ::end((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                             *)in_stack_fffffffffffff908);
                          while (bVar1 = __gnu_cxx::operator!=
                                                   ((
                                                  __normal_iterator<adios2::core::Variable<unsigned_int>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<unsigned_int>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                            local_320 = __gnu_cxx::
                                        __normal_iterator<adios2::core::Variable<unsigned_int>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>_>
                                        ::operator*(&local_310);
                            adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_int>
                                      (in_stack_fffffffffffffd70,
                                       (Variable<unsigned_int> *)in_stack_fffffffffffffd68,
                                       (BPInfo *)in_stack_fffffffffffffd60);
                            __gnu_cxx::
                            __normal_iterator<adios2::core::Variable<unsigned_int>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>_>
                            ::operator++(&local_310);
                          }
                          ReadVariableBlocks<unsigned_int>
                                    (in_stack_fffffffffffffac0,
                                     (Variable<unsigned_int> *)in_stack_fffffffffffffab8);
                          std::
                          vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                          ::clear((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                   *)0x9ea9f2);
                        }
                        else {
                          DVar4 = helper::GetDataType<unsigned_long>();
                          DVar5 = local_4c;
                          if (DVar3 == DVar4) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_348,"in call to PerformGets, EndStep or Close",
                                       &local_349);
                            pVVar14 = Engine::FindVariable<unsigned_long>
                                                ((Engine *)in_stack_fffffffffffffa70,
                                                 (string *)
                                                 CONCAT44(in_stack_fffffffffffffa6c,
                                                          in_stack_fffffffffffffa68),
                                                 in_stack_fffffffffffffa60);
                            std::__cxx11::string::~string(local_348);
                            std::allocator<char>::~allocator((allocator<char> *)&local_349);
                            local_358 = &pVVar14->m_BlocksInfo;
                            local_328 = pVVar14;
                            local_360._M_current =
                                 (BPInfo *)
                                 std::
                                 vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                 ::begin((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                          *)in_stack_fffffffffffff908);
                            local_368 = (BPInfo *)
                                        std::
                                        vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                        ::end((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                               *)in_stack_fffffffffffff908);
                            while (bVar1 = __gnu_cxx::operator!=
                                                     ((
                                                  __normal_iterator<adios2::core::Variable<unsigned_long>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<unsigned_long>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                              local_370 = __gnu_cxx::
                                          __normal_iterator<adios2::core::Variable<unsigned_long>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
                                          ::operator*(&local_360);
                              adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_long>
                                        (in_stack_fffffffffffffd70,
                                         (Variable<unsigned_long> *)in_stack_fffffffffffffd68,
                                         (BPInfo *)in_stack_fffffffffffffd60);
                              __gnu_cxx::
                              __normal_iterator<adios2::core::Variable<unsigned_long>::BPInfo_*,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>
                              ::operator++(&local_360);
                            }
                            ReadVariableBlocks<unsigned_long>
                                      (in_stack_fffffffffffffac0,
                                       (Variable<unsigned_long> *)in_stack_fffffffffffffab8);
                            std::
                            vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                            ::clear((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                     *)0x9eabcd);
                          }
                          else {
                            DVar4 = helper::GetDataType<float>();
                            DVar3 = local_4c;
                            if (DVar5 == DVar4) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_398,"in call to PerformGets, EndStep or Close",
                                         &local_399);
                              pVVar15 = Engine::FindVariable<float>
                                                  ((Engine *)in_stack_fffffffffffffa70,
                                                   (string *)
                                                   CONCAT44(in_stack_fffffffffffffa6c,
                                                            in_stack_fffffffffffffa68),
                                                   in_stack_fffffffffffffa60);
                              std::__cxx11::string::~string(local_398);
                              std::allocator<char>::~allocator((allocator<char> *)&local_399);
                              local_3a8 = &pVVar15->m_BlocksInfo;
                              local_378 = pVVar15;
                              local_3b0._M_current =
                                   (BPInfo *)
                                   std::
                                   vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                   ::begin((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                            *)in_stack_fffffffffffff908);
                              local_3b8 = (BPInfo *)
                                          std::
                                          vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                          ::end((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                                 *)in_stack_fffffffffffff908);
                              while (bVar1 = __gnu_cxx::operator!=
                                                       ((
                                                  __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                                local_3c0 = __gnu_cxx::
                                            __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
                                            ::operator*(&local_3b0);
                                adios2::format::BP3Deserializer::SetVariableBlockInfo<float>
                                          (in_stack_fffffffffffffd70,
                                           (Variable<float> *)in_stack_fffffffffffffd68,
                                           (BPInfo *)in_stack_fffffffffffffd60);
                                __gnu_cxx::
                                __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
                                ::operator++(&local_3b0);
                              }
                              ReadVariableBlocks<float>
                                        (in_stack_fffffffffffffac0,
                                         (Variable<float> *)in_stack_fffffffffffffab8);
                              std::
                              vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                              ::clear((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                       *)0x9eada8);
                            }
                            else {
                              DVar4 = helper::GetDataType<double>();
                              DVar5 = local_4c;
                              if (DVar3 == DVar4) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_3e8,"in call to PerformGets, EndStep or Close",
                                           &local_3e9);
                                pVVar16 = Engine::FindVariable<double>
                                                    ((Engine *)in_stack_fffffffffffffa70,
                                                     (string *)
                                                     CONCAT44(in_stack_fffffffffffffa6c,
                                                              in_stack_fffffffffffffa68),
                                                     in_stack_fffffffffffffa60);
                                std::__cxx11::string::~string(local_3e8);
                                std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
                                local_3f8 = &pVVar16->m_BlocksInfo;
                                local_3c8 = pVVar16;
                                local_400._M_current =
                                     (BPInfo *)
                                     std::
                                     vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                     ::begin((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                              *)in_stack_fffffffffffff908);
                                local_408 = (BPInfo *)
                                            std::
                                            vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                            ::end((
                                                  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                                  *)in_stack_fffffffffffff908);
                                while (bVar1 = __gnu_cxx::operator!=
                                                         ((
                                                  __normal_iterator<adios2::core::Variable<double>::BPInfo_*,_std::vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<double>::BPInfo_*,_std::vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                                  local_410 = __gnu_cxx::
                                              __normal_iterator<adios2::core::Variable<double>::BPInfo_*,_std::vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>_>
                                              ::operator*(&local_400);
                                  adios2::format::BP3Deserializer::SetVariableBlockInfo<double>
                                            (in_stack_fffffffffffffd70,
                                             (Variable<double> *)in_stack_fffffffffffffd68,
                                             (BPInfo *)in_stack_fffffffffffffd60);
                                  __gnu_cxx::
                                  __normal_iterator<adios2::core::Variable<double>::BPInfo_*,_std::vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>_>
                                  ::operator++(&local_400);
                                }
                                ReadVariableBlocks<double>
                                          (in_stack_fffffffffffffac0,
                                           (Variable<double> *)in_stack_fffffffffffffab8);
                                std::
                                vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                ::clear((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                         *)0x9eaf71);
                              }
                              else {
                                DVar4 = helper::GetDataType<long_double>();
                                DVar3 = local_4c;
                                if (DVar5 == DVar4) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_438,"in call to PerformGets, EndStep or Close",
                                             &local_439);
                                  pVVar17 = Engine::FindVariable<long_double>
                                                      ((Engine *)in_stack_fffffffffffffa70,
                                                       (string *)
                                                       CONCAT44(in_stack_fffffffffffffa6c,
                                                                in_stack_fffffffffffffa68),
                                                       in_stack_fffffffffffffa60);
                                  std::__cxx11::string::~string(local_438);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_439);
                                  local_448 = &pVVar17->m_BlocksInfo;
                                  local_418 = pVVar17;
                                  local_450._M_current =
                                       (BPInfo *)
                                       std::
                                       vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                       ::begin((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                *)in_stack_fffffffffffff908);
                                  local_458 = (BPInfo *)
                                              std::
                                              vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                              ::end((
                                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                  *)in_stack_fffffffffffff908);
                                  while (bVar1 = __gnu_cxx::operator!=
                                                           ((
                                                  __normal_iterator<adios2::core::Variable<long_double>::BPInfo_*,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<long_double>::BPInfo_*,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                                    local_460 = __gnu_cxx::
                                                __normal_iterator<adios2::core::Variable<long_double>::BPInfo_*,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>
                                                ::operator*(&local_450);
                                    adios2::format::BP3Deserializer::
                                    SetVariableBlockInfo<long_double>
                                              (in_stack_fffffffffffffd70,
                                               (Variable<long_double> *)in_stack_fffffffffffffd68,
                                               (BPInfo *)in_stack_fffffffffffffd60);
                                    __gnu_cxx::
                                    __normal_iterator<adios2::core::Variable<long_double>::BPInfo_*,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>
                                    ::operator++(&local_450);
                                  }
                                  ReadVariableBlocks<long_double>
                                            (in_stack_fffffffffffffac0,
                                             (Variable<long_double> *)in_stack_fffffffffffffab8);
                                  std::
                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                  ::clear((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                           *)0x9eb134);
                                }
                                else {
                                  DVar4 = helper::GetDataType<std::complex<float>>();
                                  DVar5 = local_4c;
                                  if (DVar3 == DVar4) {
                                    in_stack_fffffffffffff940 = (IO *)local_489;
                                    in_stack_fffffffffffff938 = local_48;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)(local_489 + 1),
                                               "in call to PerformGets, EndStep or Close",
                                               (allocator *)in_stack_fffffffffffff940);
                                    pVVar18 = Engine::FindVariable<std::complex<float>>
                                                        ((Engine *)in_stack_fffffffffffffa70,
                                                         (string *)
                                                         CONCAT44(in_stack_fffffffffffffa6c,
                                                                  in_stack_fffffffffffffa68),
                                                         in_stack_fffffffffffffa60);
                                    std::__cxx11::string::~string((string *)(local_489 + 1));
                                    std::allocator<char>::~allocator((allocator<char> *)local_489);
                                    local_498 = &pVVar18->m_BlocksInfo;
                                    local_468 = pVVar18;
                                    local_4a0._M_current =
                                         (BPInfo *)
                                         std::
                                         vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                         ::begin((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)in_stack_fffffffffffff908);
                                    local_4a8 = (BPInfo *)
                                                std::
                                                vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                ::end((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)in_stack_fffffffffffff908);
                                    while (bVar1 = __gnu_cxx::operator!=
                                                             ((
                                                  __normal_iterator<adios2::core::Variable<std::complex<float>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<std::complex<float>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                                      local_4b0 = __gnu_cxx::
                                                  __normal_iterator<adios2::core::Variable<std::complex<float>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>
                                                  ::operator*(&local_4a0);
                                      adios2::format::BP3Deserializer::
                                      SetVariableBlockInfo<std::complex<float>>
                                                (in_stack_fffffffffffffd70,
                                                 (Variable<std::complex<float>_> *)
                                                 in_stack_fffffffffffffd68,
                                                 (BPInfo *)in_stack_fffffffffffffd60);
                                      __gnu_cxx::
                                      __normal_iterator<adios2::core::Variable<std::complex<float>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>
                                      ::operator++(&local_4a0);
                                    }
                                    ReadVariableBlocks<std::complex<float>>
                                              (in_stack_fffffffffffffac0,
                                               (Variable<std::complex<float>_> *)
                                               in_stack_fffffffffffffab8);
                                    std::
                                    vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                    ::clear((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                             *)0x9eb2f7);
                                  }
                                  else {
                                    DVar3 = helper::GetDataType<std::complex<double>>();
                                    if (DVar5 == DVar3) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                (local_4d8,
                                                 "in call to PerformGets, EndStep or Close",
                                                 &local_4d9);
                                      in_stack_fffffffffffff910 =
                                           Engine::FindVariable<std::complex<double>>
                                                     ((Engine *)in_stack_fffffffffffffa70,
                                                      (string *)
                                                      CONCAT44(in_stack_fffffffffffffa6c,
                                                               in_stack_fffffffffffffa68),
                                                      in_stack_fffffffffffffa60);
                                      std::__cxx11::string::~string(local_4d8);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_4d9);
                                      local_4e8 = &in_stack_fffffffffffff910->m_BlocksInfo;
                                      local_4b8 = in_stack_fffffffffffff910;
                                      local_4f0._M_current =
                                           (BPInfo *)
                                           std::
                                           vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                           ::begin((
                                                  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                                  *)in_stack_fffffffffffff908);
                                      std::
                                      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                      ::end((vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                             *)in_stack_fffffffffffff908);
                                      while (bVar1 = __gnu_cxx::operator!=
                                                               ((
                                                  __normal_iterator<adios2::core::Variable<std::complex<double>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff910,
                                                  (
                                                  __normal_iterator<adios2::core::Variable<std::complex<double>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>_>
                                                  *)in_stack_fffffffffffff908), bVar1) {
                                        __gnu_cxx::
                                        __normal_iterator<adios2::core::Variable<std::complex<double>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>_>
                                        ::operator*(&local_4f0);
                                        adios2::format::BP3Deserializer::
                                        SetVariableBlockInfo<std::complex<double>>
                                                  (in_stack_fffffffffffffd70,
                                                   (Variable<std::complex<double>_> *)
                                                   in_stack_fffffffffffffd68,
                                                   (BPInfo *)in_stack_fffffffffffffd60);
                                        __gnu_cxx::
                                        __normal_iterator<adios2::core::Variable<std::complex<double>_>::BPInfo_*,_std::vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>_>
                                        ::operator++(&local_4f0);
                                      }
                                      ReadVariableBlocks<std::complex<double>>
                                                (in_stack_fffffffffffffac0,
                                                 (Variable<std::complex<double>_> *)
                                                 in_stack_fffffffffffffab8);
                                      std::
                                      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                      ::clear((vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                               *)0x9eb4ba);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff910);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x9eb515);
    local_24 = 0;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffff910);
  return;
}

Assistant:

void BP3Reader::PerformGets()
{
    PERFSTUBS_SCOPED_TIMER("BP3Reader::PerformGets");
    if (m_BP3Deserializer.m_DeferredVariables.empty())
    {
        return;
    }

    for (const std::string &name : m_BP3Deserializer.m_DeferredVariables)
    {
        const DataType type = m_IO.InquireVariableType(name);

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable = FindVariable<T>(name, "in call to PerformGets, EndStep or Close"); \
        for (auto &blockInfo : variable.m_BlocksInfo)                                              \
        {                                                                                          \
            m_BP3Deserializer.SetVariableBlockInfo(variable, blockInfo);                           \
        }                                                                                          \
        ReadVariableBlocks(variable);                                                              \
        variable.m_BlocksInfo.clear();                                                             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }

    m_BP3Deserializer.m_DeferredVariables.clear();
}